

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O0

FT_Error raccess_guess_linux_double_from_file_name
                   (FT_Library library,char *file_name,FT_Long *result_offset)

{
  char *pcStack_78;
  FT_Error error;
  char *nouse;
  FT_Stream stream2;
  FT_Open_Args args2;
  FT_Long *result_offset_local;
  char *file_name_local;
  FT_Library library_local;
  
  pcStack_78 = (char *)0x0;
  stream2._0_4_ = 4;
  args2.memory_size = (FT_Long)file_name;
  args2.params = (FT_Parameter *)result_offset;
  library_local._4_4_ = FT_Stream_New(library,(FT_Open_Args *)&stream2,(FT_Stream *)&nouse);
  if (library_local._4_4_ == 0) {
    library_local._4_4_ =
         raccess_guess_apple_double
                   (library,(FT_Stream)nouse,file_name,&stack0xffffffffffffff88,
                    (FT_Long *)args2.params);
    FT_Stream_Free((FT_Stream)nouse,0);
  }
  return library_local._4_4_;
}

Assistant:

static FT_Error
  raccess_guess_linux_double_from_file_name( FT_Library  library,
                                             char       *file_name,
                                             FT_Long    *result_offset )
  {
    FT_Open_Args  args2;
    FT_Stream     stream2;
    char*         nouse = NULL;
    FT_Error      error;


    args2.flags    = FT_OPEN_PATHNAME;
    args2.pathname = file_name;
    error = FT_Stream_New( library, &args2, &stream2 );
    if ( error )
      return error;

    error = raccess_guess_apple_double( library, stream2, file_name,
                                        &nouse, result_offset );

    FT_Stream_Free( stream2, 0 );

    return error;
  }